

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsOptions.h
# Opt level: O2

void __thiscall OptionRecordString::~OptionRecordString(OptionRecordString *this)

{
  ~OptionRecordString(this);
  operator_delete(this);
  return;
}

Assistant:

virtual ~OptionRecordString() {}